

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O2

TString * LoadString(LoadState *S)

{
  size_t l;
  byte bVar1;
  TString *pTVar2;
  size_t size;
  char buff [40];
  
  bVar1 = LoadByte(S);
  size = (size_t)bVar1;
  if (bVar1 == 0xff) {
    LoadBlock(S,&size,8);
  }
  if (size == 0) {
    pTVar2 = (TString *)0x0;
  }
  else {
    l = size - 1;
    if (size < 0x2a) {
      size = l;
      LoadBlock(S,buff,l);
      pTVar2 = luaS_newlstr(S->L,buff,size);
    }
    else {
      size = l;
      pTVar2 = luaS_createlngstrobj(S->L,l);
      LoadBlock(S,pTVar2 + 1,size);
    }
  }
  return pTVar2;
}

Assistant:

static TString *LoadString(LoadState *S) {
    size_t size = LoadByte(S);
    if (size == 0xFF)
        LoadVar(S, size);
    if (size == 0)
        return NULL;
    else if (--size <= LUAI_MAXSHORTLEN) {  /* short string? */
        char buff[LUAI_MAXSHORTLEN];
        LoadVector(S, buff, size);
        return luaS_newlstr(S->L, buff, size);
    } else {  /* long string */
        TString *ts = luaS_createlngstrobj(S->L, size);
        LoadVector(S, getstr(ts), size);  /* load directly in final place */
        return ts;
    }
}